

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O0

void brotli::BuildMetaBlockGreedy
               (uint8_t *ringbuffer,size_t pos,size_t mask,Command *commands,size_t n_commands,
               MetaBlockSplit *mb)

{
  ulong uVar1;
  ulong uVar2;
  Command *pCVar3;
  ulong local_1c0;
  size_t j;
  Command cmd;
  size_t i_1;
  BlockSplitter<brotli::Histogram<520>_> dist_blocks;
  BlockSplitter<brotli::Histogram<704>_> cmd_blocks;
  BlockSplitter<brotli::Histogram<256>_> lit_blocks;
  size_t i;
  size_t num_literals;
  MetaBlockSplit *mb_local;
  size_t n_commands_local;
  Command *commands_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *ringbuffer_local;
  
  i = 0;
  for (lit_blocks.merge_last_count_ = 0; lit_blocks.merge_last_count_ < n_commands;
      lit_blocks.merge_last_count_ = lit_blocks.merge_last_count_ + 1) {
    i = commands[lit_blocks.merge_last_count_].insert_len_ + i;
  }
  BlockSplitter<brotli::Histogram<256>_>::BlockSplitter
            ((BlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_,0x100,0x200,
             400.0,i,&mb->literal_split,&mb->literal_histograms);
  BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
            ((BlockSplitter<brotli::Histogram<704>_> *)&dist_blocks.merge_last_count_,0x2c0,0x400,
             500.0,n_commands,&mb->command_split,&mb->command_histograms);
  BlockSplitter<brotli::Histogram<520>_>::BlockSplitter
            ((BlockSplitter<brotli::Histogram<520>_> *)&i_1,0x40,0x200,100.0,n_commands,
             &mb->distance_split,&mb->distance_histograms);
  cmd.dist_extra_ = 0;
  cmd.cmd_prefix_ = 0;
  cmd.dist_prefix_ = 0;
  mask_local = pos;
  for (; (ulong)cmd._16_8_ < n_commands; cmd._16_8_ = cmd._16_8_ + 1) {
    pCVar3 = commands + cmd._16_8_;
    uVar1._0_4_ = pCVar3->insert_len_;
    uVar1._4_4_ = pCVar3->copy_len_;
    uVar2._0_4_ = pCVar3->dist_extra_;
    uVar2._4_2_ = pCVar3->cmd_prefix_;
    uVar2._6_2_ = pCVar3->dist_prefix_;
    BlockSplitter<brotli::Histogram<704>_>::AddSymbol
              ((BlockSplitter<brotli::Histogram<704>_> *)&dist_blocks.merge_last_count_,
               uVar2 >> 0x20 & 0xffff);
    for (local_1c0 = uVar1 & 0xffffffff; local_1c0 != 0; local_1c0 = local_1c0 - 1) {
      BlockSplitter<brotli::Histogram<256>_>::AddSymbol
                ((BlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_,
                 (ulong)ringbuffer[mask_local & mask]);
      mask_local = mask_local + 1;
    }
    mask_local = (uint)uVar1._4_4_ + mask_local;
    if ((uVar1._4_4_ != 0) && (0x7f < (ushort)uVar2._4_2_)) {
      BlockSplitter<brotli::Histogram<520>_>::AddSymbol
                ((BlockSplitter<brotli::Histogram<520>_> *)&i_1,uVar2 >> 0x30);
    }
  }
  BlockSplitter<brotli::Histogram<256>_>::FinishBlock
            ((BlockSplitter<brotli::Histogram<256>_> *)&cmd_blocks.merge_last_count_,true);
  BlockSplitter<brotli::Histogram<704>_>::FinishBlock
            ((BlockSplitter<brotli::Histogram<704>_> *)&dist_blocks.merge_last_count_,true);
  BlockSplitter<brotli::Histogram<520>_>::FinishBlock
            ((BlockSplitter<brotli::Histogram<520>_> *)&i_1,true);
  return;
}

Assistant:

void BuildMetaBlockGreedy(const uint8_t* ringbuffer,
                          size_t pos,
                          size_t mask,
                          const Command *commands,
                          size_t n_commands,
                          MetaBlockSplit* mb) {
  size_t num_literals = 0;
  for (size_t i = 0; i < n_commands; ++i) {
    num_literals += commands[i].insert_len_;
  }

  BlockSplitter<HistogramLiteral> lit_blocks(
      256, 512, 400.0, num_literals,
      &mb->literal_split, &mb->literal_histograms);
  BlockSplitter<HistogramCommand> cmd_blocks(
      kNumCommandPrefixes, 1024, 500.0, n_commands,
      &mb->command_split, &mb->command_histograms);
  BlockSplitter<HistogramDistance> dist_blocks(
      64, 512, 100.0, n_commands,
      &mb->distance_split, &mb->distance_histograms);

  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    cmd_blocks.AddSymbol(cmd.cmd_prefix_);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      lit_blocks.AddSymbol(ringbuffer[pos & mask]);
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      dist_blocks.AddSymbol(cmd.dist_prefix_);
    }
  }

  lit_blocks.FinishBlock(/* is_final = */ true);
  cmd_blocks.FinishBlock(/* is_final = */ true);
  dist_blocks.FinishBlock(/* is_final = */ true);
}